

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O1

int YUY2ToARGB(uint8_t *src_yuy2,int src_stride_yuy2,uint8_t *dst_argb,int dst_stride_argb,int width
              ,int height)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  code *pcVar4;
  code *pcVar5;
  
  iVar3 = -1;
  if ((height != 0 && 0 < width) && (dst_argb != (uint8_t *)0x0 && src_yuy2 != (uint8_t *)0x0)) {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      src_yuy2 = src_yuy2 + ~height * src_stride_yuy2;
      src_stride_yuy2 = -src_stride_yuy2;
    }
    if (width * 4 == dst_stride_argb && width * 2 == src_stride_yuy2) {
      width = iVar1 * width;
      src_stride_yuy2 = 0;
      dst_stride_argb = 0;
      iVar1 = 1;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 0xfU) == 0) {
      pcVar5 = YUY2ToARGBRow_SSSE3;
    }
    else {
      pcVar5 = YUY2ToARGBRow_Any_SSSE3;
    }
    if ((uVar2 & 0x40) == 0) {
      pcVar5 = YUY2ToARGBRow_C;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 0x1fU) == 0) {
      pcVar4 = YUY2ToARGBRow_AVX2;
    }
    else {
      pcVar4 = YUY2ToARGBRow_Any_AVX2;
    }
    if ((uVar2 >> 10 & 1) == 0) {
      pcVar4 = pcVar5;
    }
    iVar3 = 0;
    if (0 < iVar1) {
      do {
        (*pcVar4)(src_yuy2,dst_argb,&kYuvI601Constants,width);
        src_yuy2 = src_yuy2 + src_stride_yuy2;
        dst_argb = dst_argb + dst_stride_argb;
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

LIBYUV_API
int YUY2ToARGB(const uint8_t* src_yuy2,
               int src_stride_yuy2,
               uint8_t* dst_argb,
               int dst_stride_argb,
               int width,
               int height) {
  int y;
  void (*YUY2ToARGBRow)(const uint8_t* src_yuy2, uint8_t* dst_argb,
                        const struct YuvConstants* yuvconstants, int width) =
      YUY2ToARGBRow_C;
  if (!src_yuy2 || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_yuy2 = src_yuy2 + (height - 1) * src_stride_yuy2;
    src_stride_yuy2 = -src_stride_yuy2;
  }
  // Coalesce rows.
  if (src_stride_yuy2 == width * 2 && dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_yuy2 = dst_stride_argb = 0;
  }
#if defined(HAS_YUY2TOARGBROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    YUY2ToARGBRow = YUY2ToARGBRow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      YUY2ToARGBRow = YUY2ToARGBRow_SSSE3;
    }
  }
#endif
#if defined(HAS_YUY2TOARGBROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    YUY2ToARGBRow = YUY2ToARGBRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      YUY2ToARGBRow = YUY2ToARGBRow_AVX2;
    }
  }
#endif
#if defined(HAS_YUY2TOARGBROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    YUY2ToARGBRow = YUY2ToARGBRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      YUY2ToARGBRow = YUY2ToARGBRow_NEON;
    }
  }
#endif
#if defined(HAS_YUY2TOARGBROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    YUY2ToARGBRow = YUY2ToARGBRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      YUY2ToARGBRow = YUY2ToARGBRow_MMI;
    }
  }
#endif
#if defined(HAS_YUY2TOARGBROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    YUY2ToARGBRow = YUY2ToARGBRow_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      YUY2ToARGBRow = YUY2ToARGBRow_MSA;
    }
  }
#endif
  for (y = 0; y < height; ++y) {
    YUY2ToARGBRow(src_yuy2, dst_argb, &kYuvI601Constants, width);
    src_yuy2 += src_stride_yuy2;
    dst_argb += dst_stride_argb;
  }
  return 0;
}